

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void throw(hd_context *ctx)

{
  int *piVar1;
  
  piVar1 = (int *)ctx->user;
  if (piVar1 < &ctx->alloc) {
    fprintf(_stderr,"uncaught exception: %s\n",ctx[0xaa].contents + 0xa4);
    exit(1);
  }
  *piVar1 = *piVar1 + 2;
  siglongjmp((__jmp_buf_tag *)(piVar1 + 2),1);
}

Assistant:

HD_NORETURN static void throw(hd_context *ctx)
{
    if (ctx->error->top >= ctx->error->stack)
    {
        ctx->error->top->code += 2;
        hd_longjmp(ctx->error->top->buffer, 1);
    }
    else
    {
        fprintf(stderr, "uncaught exception: %s\n", ctx->error->message);
#ifdef USE_OUTPUT_DEBUG_STRING
        OutputDebugStringA("uncaught exception: ");
		OutputDebugStringA(ctx->error->message);
		OutputDebugStringA("\n");
#endif
        exit(EXIT_FAILURE);
    }
}